

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::ResultBuilder::ResultBuilder
          (ResultBuilder *this,Enum at,char *file,int line,char *expr,char *exception_type,
          char *exception_string)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_ffffffffffffffe0;
  
  AssertData::AssertData((AssertData *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  *in_RDI = *(undefined8 *)(g_cs + 0x20);
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  in_RDI[2] = in_RDX;
  *(undefined4 *)(in_RDI + 3) = in_ECX;
  in_RDI[4] = in_R8;
  *(undefined1 *)(in_RDI + 5) = 1;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)(in_RDI + 0xc) = 0;
  in_RDI[0xd] = in_R9;
  in_RDI[0xe] = exception_type;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(assertType::Enum at, const char* file, int line, const char* expr,
                                 const char* exception_type, const char* exception_string) {
        m_test_case        = g_cs->currentTest;
        m_at               = at;
        m_file             = file;
        m_line             = line;
        m_expr             = expr;
        m_failed           = true;
        m_threw            = false;
        m_threw_as         = false;
        m_exception_type   = exception_type;
        m_exception_string = exception_string;
#if DOCTEST_MSVC
        if(m_expr[0] == ' ') // this happens when variadic macros are disabled under MSVC
            ++m_expr;
#endif // MSVC
    }